

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# package.cpp
# Opt level: O3

char * __thiscall icu_63::Package::allocString(Package *this,UBool in,int32_t length)

{
  uint uVar1;
  int iVar2;
  char *__s2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint extraout_EDX;
  Item *pIVar6;
  undefined7 in_register_00000031;
  char *__s1;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  char *pcVar11;
  
  __s1 = (char *)CONCAT71(in_register_00000031,in);
  iVar4 = this->inStringTop;
  iVar2 = this->outStringTop;
  iVar5 = iVar2;
  if (in != '\0') {
    iVar5 = iVar4;
  }
  iVar5 = length + iVar5 + 1;
  if (iVar5 < 0x186a1) {
    if (in != '\0') {
      this->inStringTop = iVar5;
      return this->inStrings + iVar4;
    }
    this->outStringTop = iVar5;
    return this->outStrings + iVar2;
  }
  allocString();
  uVar8 = this->itemCount;
  if ((int)uVar8 < 1) {
    return (char *)0xffffffff;
  }
  pIVar6 = this->items;
  uVar10 = 0;
  while( true ) {
    uVar1 = uVar8 + uVar10;
    uVar9 = uVar1 >> 1;
    pcVar11 = (char *)(ulong)uVar9;
    __s2 = pIVar6[(long)pcVar11].name;
    if ((int)extraout_EDX < 0) {
      iVar4 = strcmp(__s1,__s2);
    }
    else {
      iVar4 = strncmp(__s1,__s2,(ulong)extraout_EDX);
    }
    if (iVar4 == 0) break;
    if (-1 < iVar4) {
      uVar10 = uVar9 + 1;
      uVar9 = uVar8;
    }
    uVar8 = uVar9;
    if ((int)uVar8 <= (int)uVar10) {
      return (char *)(ulong)~uVar10;
    }
  }
  if ((int)extraout_EDX < 0) {
    return pcVar11;
  }
  if (1 < uVar1) {
    pIVar6 = pIVar6 + (uVar1 >> 1);
    uVar7 = (ulong)(uVar1 >> 1);
    do {
      pIVar6 = pIVar6 + -1;
      iVar4 = strncmp(__s1,pIVar6->name,(ulong)extraout_EDX);
      if (iVar4 != 0) {
        return (char *)(uVar7 & 0xffffffff);
      }
      bVar3 = 1 < (long)uVar7;
      uVar7 = uVar7 - 1;
    } while (bVar3);
    return (char *)0x0;
  }
  return pcVar11;
}

Assistant:

char *
Package::allocString(UBool in, int32_t length) {
    char *p;
    int32_t top;

    if(in) {
        top=inStringTop;
        p=inStrings+top;
    } else {
        top=outStringTop;
        p=outStrings+top;
    }
    top+=length+1;

    if(top>STRING_STORE_SIZE) {
        fprintf(stderr, "icupkg: string storage overflow\n");
        exit(U_BUFFER_OVERFLOW_ERROR);
    }
    if(in) {
        inStringTop=top;
    } else {
        outStringTop=top;
    }
    return p;
}